

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobalGet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  GlobalType global_type;
  GlobalType local_70;
  Var local_68;
  
  this->expr_loc_ = loc;
  local_70.type.enum_ = Any;
  local_70.mutable_ = true;
  Var::Var(&local_68,global_var);
  RVar1 = CheckGlobalIndex(this,&local_68,&local_70);
  Var::~Var(&local_68);
  RVar2 = TypeChecker::OnGlobalGet(&this->typechecker_,local_70.type);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnGlobalGet(const Location& loc, Var global_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  result |= typechecker_.OnGlobalGet(global_type.type);
  return result;
}